

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O0

Fl_Menu_Item * first_submenu_item(Fl_Menu_Item *item,Fl_Menu_Item *start)

{
  Fl_Menu_Item *pFVar1;
  Fl_Menu_Item *first;
  Fl_Menu_Item *pFStack_28;
  int nest;
  Fl_Menu_Item *m;
  Fl_Menu_Item *start_local;
  Fl_Menu_Item *item_local;
  
  first._4_4_ = 0;
  pFStack_28 = start;
  do {
    if (pFStack_28->text == (char *)0x0) {
      if (first._4_4_ == 0) {
        return (Fl_Menu_Item *)0x0;
      }
      first._4_4_ = first._4_4_ + -1;
    }
    else {
      if (pFStack_28 == item) {
        return start;
      }
      if ((pFStack_28->flags & 0x20U) == 0) {
        if ((pFStack_28->flags & 0x40U) != 0) {
          first._4_4_ = first._4_4_ + 1;
        }
      }
      else {
        pFVar1 = (Fl_Menu_Item *)Fl_Menu_Item::user_data(pFStack_28);
        pFVar1 = first_submenu_item(item,pFVar1);
        if (pFVar1 != (Fl_Menu_Item *)0x0) {
          return pFVar1;
        }
      }
    }
    pFStack_28 = pFStack_28 + 1;
  } while( true );
}

Assistant:

static Fl_Menu_Item *first_submenu_item(Fl_Menu_Item *item, Fl_Menu_Item *start)
{
  Fl_Menu_Item* m = start;
  int nest = 0; // will indicate submenu nesting depth
  while (1) { // loop over all menu items
    if (!m->text) { // m is a null item
      if (!nest) return NULL; // item was not found
      nest--; // m marks the end of a submenu -> decrement submenu nesting depth
    } else { // a true item
      if (m == item) return start; // item is found, return menu start item
      if (m->flags & FL_SUBMENU_POINTER) {
        // scan the detached submenu which begins at m->user_data()
        Fl_Menu_Item *first = first_submenu_item(item, (Fl_Menu_Item*)m->user_data());
        if (first) return first; // if item was found in the submenu, return
      }
      else if (m->flags & FL_SUBMENU) { // a direct submenu
        nest++; // increment submenu nesting depth
      }
    }
    m++; // step to next menu item
  }
}